

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall glu::ImmutableTexture2D::upload(ImmutableTexture2D *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  TestError *this_00;
  TextureFormat *pTVar9;
  TransferFormat TVar10;
  ConstPixelBufferAccess *pCVar11;
  void *pvVar12;
  undefined1 local_68 [8];
  ConstPixelBufferAccess access;
  int levelNdx;
  deUint32 local_34;
  deUint32 dStack_30;
  TransferFormat transferFormat;
  Functions *gl;
  ImmutableTexture2D *this_local;
  long lVar8;
  
  iVar3 = (*((this->super_Texture2D).m_context)->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  while ((dVar4 = ::deGetFalse(), dVar4 == 0 && ((this->super_Texture2D).m_glTexture != 0))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      (**(code **)(lVar8 + 0xb8))(0xde1,(this->super_Texture2D).m_glTexture);
      pcVar1 = *(code **)(lVar8 + 0xff0);
      pTVar9 = tcu::TextureLevelPyramid::getFormat
                         (&(this->super_Texture2D).m_refTexture.super_TextureLevelPyramid);
      iVar3 = computePixelStore(pTVar9);
      (*pcVar1)(0xcf5,iVar3);
      dVar5 = (**(code **)(lVar8 + 0x800))();
      checkError(dVar5,"Texture upload failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x12e);
      pTVar9 = tcu::TextureLevelPyramid::getFormat
                         (&(this->super_Texture2D).m_refTexture.super_TextureLevelPyramid);
      unique0x00012000 = *pTVar9;
      TVar10 = getTransferFormat(unique0x00012000);
      pcVar1 = *(code **)(lVar8 + 0x1380);
      iVar3 = tcu::TextureLevelPyramid::getNumLevels
                        (&(this->super_Texture2D).m_refTexture.super_TextureLevelPyramid);
      dVar5 = (this->super_Texture2D).m_format;
      iVar6 = tcu::Texture2D::getWidth(&(this->super_Texture2D).m_refTexture);
      iVar7 = tcu::Texture2D::getHeight(&(this->super_Texture2D).m_refTexture);
      (*pcVar1)(0xde1,iVar3,dVar5,iVar6,iVar7);
      for (access.m_data._0_4_ = 0; iVar3 = (int)access.m_data,
          iVar6 = tcu::TextureLevelPyramid::getNumLevels
                            (&(this->super_Texture2D).m_refTexture.super_TextureLevelPyramid),
          iVar3 < iVar6; access.m_data._0_4_ = (int)access.m_data + 1) {
        bVar2 = tcu::TextureLevelPyramid::isLevelEmpty
                          (&(this->super_Texture2D).m_refTexture.super_TextureLevelPyramid,
                           (int)access.m_data);
        if (!bVar2) {
          pCVar11 = &tcu::TextureLevelPyramid::getLevel
                               (&(this->super_Texture2D).m_refTexture.super_TextureLevelPyramid,
                                (int)access.m_data)->super_ConstPixelBufferAccess;
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_68,pCVar11);
          iVar3 = (int)access.m_data;
          pcVar1 = *(code **)(lVar8 + 0x13b8);
          iVar6 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_68);
          iVar7 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_68);
          local_34 = TVar10.format;
          dStack_30 = TVar10.dataType;
          pvVar12 = tcu::ConstPixelBufferAccess::getDataPtr((ConstPixelBufferAccess *)local_68);
          (*pcVar1)(0xde1,iVar3,0,0,iVar6,iVar7,local_34,dStack_30,pvVar12);
        }
      }
      dVar5 = (**(code **)(lVar8 + 0x800))();
      checkError(dVar5,"Texture upload failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x13d);
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_glTexture",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,299);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void ImmutableTexture2D::upload (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	DE_ASSERT(!m_isCompressed);

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_2D, m_glTexture);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(m_refTexture.getFormat()));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");

	TransferFormat transferFormat = getTransferFormat(m_refTexture.getFormat());

	gl.texStorage2D(GL_TEXTURE_2D, m_refTexture.getNumLevels(), m_format, m_refTexture.getWidth(), m_refTexture.getHeight());
	for (int levelNdx = 0; levelNdx < m_refTexture.getNumLevels(); levelNdx++)
	{
		if (m_refTexture.isLevelEmpty(levelNdx))
			continue; // Don't upload.

		tcu::ConstPixelBufferAccess access = m_refTexture.getLevel(levelNdx);
		DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*access.getWidth());
		gl.texSubImage2D(GL_TEXTURE_2D, levelNdx, 0, 0, access.getWidth(), access.getHeight(),  transferFormat.format, transferFormat.dataType, access.getDataPtr());
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}